

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int isshortstr(FuncState *fs,int kk)

{
  if (-1 < (char)kk) {
    return 0;
  }
  if (-1 < kk) {
    if ((int)(kk & 0xffffff7fU) < fs->f->sizek) {
      return (uint)(fs->f->k[kk & 0xffffff7fU].tt_ == 0x8004);
    }
  }
  __assert_fail("kk >= 0 && kk < f->sizek",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                ,0x241,"int isshortstr(FuncState *, int)");
}

Assistant:

static int isshortstr(FuncState *fs, int kk) {
  if (ISK(kk)) {
    Proto *f = fs->f;
    kk = INDEXK(kk);
    lua_assert(kk >= 0 && kk < f->sizek);
    return ttisshrstring(&f->k[kk]);
  }
  return 0;
}